

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
SBarInfoCommand::GetCoordinates
          (SBarInfoCommand *this,FScanner *sc,bool fullScreenOffsets,SBarInfoCoordinate *x,
          SBarInfoCoordinate *y)

{
  SBarInfoCoordinate *pSVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int i;
  long lVar5;
  SBarInfoCoordinate *coords [2];
  
  lVar5 = 0;
  coords[0] = x;
  coords[1] = y;
  do {
    if (lVar5 == 1) {
      FScanner::MustGetToken(sc,0x2c);
    }
    else if (lVar5 == 2) {
      return;
    }
    bVar2 = FScanner::CheckToken(sc,0x2d);
    FScanner::MustGetToken(sc,0x104);
    pSVar1 = coords[lVar5];
    iVar4 = -sc->Number;
    if (!bVar2) {
      iVar4 = sc->Number;
    }
    *pSVar1 = (SBarInfoCoordinate)(iVar4 * 2);
    bVar2 = FScanner::CheckToken(sc,0x2b);
    if (bVar2) {
      FScanner::MustGetToken(sc,0x101);
      bVar3 = FScanner::Compare(sc,"center");
      if (!bVar3) {
        FScanner::ScriptError(sc,"Expected \'center\' but got \'%s\' instead.",sc->String);
      }
    }
    if (fullScreenOffsets) {
      *pSVar1 = (SBarInfoCoordinate)((uint)*pSVar1 & 0xfffffffe | (uint)bVar2);
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void		GetCoordinates(FScanner &sc, bool fullScreenOffsets, SBarInfoCoordinate &x, SBarInfoCoordinate &y)
		{
			bool negative = false;
			bool relCenter = false;
			SBarInfoCoordinate *coords[2] = {&x, &y};
			for(int i = 0;i < 2;i++)
			{
				negative = false;
				relCenter = false;
				if(i > 0)
					sc.MustGetToken(',');
			
				// [-]INT center
				negative = sc.CheckToken('-');
				sc.MustGetToken(TK_IntConst);
				coords[i]->Set(negative ? -sc.Number : sc.Number, false);
				if(sc.CheckToken('+'))
				{
					sc.MustGetToken(TK_Identifier);
					if(!sc.Compare("center"))
						sc.ScriptError("Expected 'center' but got '%s' instead.", sc.String);
					relCenter = true;
				}
				if(fullScreenOffsets)
				{
					coords[i]->SetRelCenter(relCenter);
				}
			}

			//if(!fullScreenOffsets)
			//	y.SetCoord((negative ? -sc.Number : sc.Number) - (200 - script->height));
		}